

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O3

void __thiscall egc::Sequencer::ADS(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ushort uVar5;
  uint uVar6;
  ostream *poVar7;
  uint uVar8;
  unsigned_short overflow;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ADS",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar7;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  uVar3 = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,instruction & 0x3ff,0);
  uVar4 = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0,0);
  uVar8 = (uint)uVar4 + (uint)uVar3;
  uVar6 = uVar4 & 0x4000;
  uVar8 = ((uVar8 & 0xffff) >> 0xf) + uVar8;
  uVar5 = (ushort)uVar6;
  overflow = 0x7ffe;
  if ((uVar4 & 0x4000) == 0) {
    overflow = 1;
  }
  uVar6 = uVar8 & 0x3fff | uVar6;
  if (uVar5 == ((ushort)uVar8 & 0x4000) || uVar5 != (uVar3 & 0x4000)) {
    overflow = 0;
    uVar6 = uVar8;
  }
  uVar3 = (unsigned_short)(uVar6 & 0x7fff);
  if ((uVar6 & 0x7fff) == 0) {
    uVar3 = 0x7fff;
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                instruction & 0x3ff,uVar3);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,uVar3);
  Memory::SetAccumulatorOverflow
            ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             overflow);
  return;
}

Assistant:

void egc::Sequencer::ADS (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "ADS" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto [result, overflow] = AddWords(a, mk);

    m_Memory->Write(k, result);
    m_Memory->Write(00000u, result);

    m_Memory->SetAccumulatorOverflow(overflow);
}